

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

void * asio::aligned_new(size_t align,size_t size)

{
  ulong in_RSI;
  ulong in_RDI;
  bad_alloc ex;
  void *ptr;
  bad_alloc *this;
  ulong local_40;
  ulong local_38;
  bad_alloc local_20 [8];
  void *local_18;
  ulong local_10;
  ulong local_8;
  
  local_38 = in_RDI;
  if (in_RDI < 0x10) {
    local_38 = 0x10;
  }
  local_8 = local_38;
  local_40 = in_RSI;
  if (in_RSI % local_38 != 0) {
    local_40 = in_RSI + (local_38 - in_RSI % local_38);
  }
  local_10 = local_40;
  local_18 = (void *)aligned_alloc(local_38,local_40);
  if (local_18 == (void *)0x0) {
    this = local_20;
    CLI::std::bad_alloc::bad_alloc(this);
    detail::throw_exception<std::bad_alloc>((bad_alloc *)this);
    std::bad_alloc::~bad_alloc((bad_alloc *)local_20);
  }
  return local_18;
}

Assistant:

inline void* aligned_new(std::size_t align, std::size_t size)
{
#if defined(ASIO_HAS_STD_ALIGNED_ALLOC)
  align = (align < ASIO_DEFAULT_ALIGN) ? ASIO_DEFAULT_ALIGN : align;
  size = (size % align == 0) ? size : size + (align - size % align);
  void* ptr = std::aligned_alloc(align, size);
  if (!ptr)
  {
    std::bad_alloc ex;
    asio::detail::throw_exception(ex);
  }
  return ptr;
#elif defined(ASIO_HAS_BOOST_ALIGN)
  align = (align < ASIO_DEFAULT_ALIGN) ? ASIO_DEFAULT_ALIGN : align;
  size = (size % align == 0) ? size : size + (align - size % align);
  void* ptr = boost::alignment::aligned_alloc(align, size);
  if (!ptr)
  {
    std::bad_alloc ex;
    asio::detail::throw_exception(ex);
  }
  return ptr;
#elif defined(ASIO_MSVC)
  align = (align < ASIO_DEFAULT_ALIGN) ? ASIO_DEFAULT_ALIGN : align;
  size = (size % align == 0) ? size : size + (align - size % align);
  void* ptr = _aligned_malloc(size, align);
  if (!ptr)
  {
    std::bad_alloc ex;
    asio::detail::throw_exception(ex);
  }
  return ptr;
#else // defined(ASIO_MSVC)
  (void)align;
  return ::operator new(size);
#endif // defined(ASIO_MSVC)
}